

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiWindowSettings * ImGui::CreateNewWindowSettings(char *name)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  ImGuiWindowSettings *pIVar4;
  ImGuiContext *pIVar5;
  ImU32 IVar6;
  ImGuiWindowSettings *pIVar7;
  char *pcVar8;
  int iVar9;
  int iVar10;
  ImGuiContext *ctx;
  
  pIVar5 = GImGui;
  iVar10 = (GImGui->SettingsWindows).Size;
  iVar3 = (GImGui->SettingsWindows).Capacity;
  if (iVar10 == iVar3) {
    iVar10 = iVar10 + 1;
    if (iVar3 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar3 / 2 + iVar3;
    }
    if (iVar10 < iVar9) {
      iVar10 = iVar9;
    }
    if (iVar3 < iVar10) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar2 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar2 = *piVar2 + 1;
      }
      pIVar7 = (ImGuiWindowSettings *)
               (*GImAllocatorAllocFunc)((long)iVar10 * 0x18,GImAllocatorUserData);
      pIVar4 = (pIVar5->SettingsWindows).Data;
      if (pIVar4 != (ImGuiWindowSettings *)0x0) {
        memcpy(pIVar7,pIVar4,(long)(pIVar5->SettingsWindows).Size * 0x18);
        pIVar4 = (pIVar5->SettingsWindows).Data;
        if ((pIVar4 != (ImGuiWindowSettings *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar2 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar2 = *piVar2 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
      }
      (pIVar5->SettingsWindows).Data = pIVar7;
      (pIVar5->SettingsWindows).Capacity = iVar10;
    }
  }
  pIVar7 = (pIVar5->SettingsWindows).Data;
  iVar10 = (pIVar5->SettingsWindows).Size;
  pIVar4 = pIVar7 + iVar10;
  pIVar4->Name = (char *)0x0;
  pIVar4->ID = 0;
  (pIVar4->Pos).x = 0;
  (pIVar4->Pos).y = 0;
  *(undefined8 *)((long)&pIVar7[iVar10].Pos.x + 1) = 0;
  iVar10 = (pIVar5->SettingsWindows).Size;
  uVar1 = iVar10 + 1;
  (pIVar5->SettingsWindows).Size = uVar1;
  if (-1 < iVar10) {
    pIVar4 = (pIVar5->SettingsWindows).Data;
    pIVar7 = pIVar4 + ((ulong)uVar1 - 1);
    pcVar8 = strstr(name,"###");
    if (pcVar8 != (char *)0x0) {
      name = pcVar8;
    }
    pcVar8 = ImStrdup(name);
    pIVar7->Name = pcVar8;
    IVar6 = ImHashStr(name,0,0);
    pIVar4[(ulong)uVar1 - 1].ID = IVar6;
    return pIVar7;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui.h"
                ,0x4e8,"T &ImVector<ImGuiWindowSettings>::back() [T = ImGuiWindowSettings]");
}

Assistant:

ImGuiWindowSettings* ImGui::CreateNewWindowSettings(const char* name)
{
    ImGuiContext& g = *GImGui;
    g.SettingsWindows.push_back(ImGuiWindowSettings());
    ImGuiWindowSettings* settings = &g.SettingsWindows.back();
#if !IMGUI_DEBUG_INI_SETTINGS
    // Skip to the "###" marker if any. We don't skip past to match the behavior of GetID()
    // Preserve the full string when IMGUI_DEBUG_INI_SETTINGS is set to make .ini inspection easier.
    if (const char* p = strstr(name, "###"))
        name = p;
#endif
    settings->Name = ImStrdup(name);
    settings->ID = ImHashStr(name);
    return settings;
}